

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trace_geodesic.cpp
# Opt level: O2

TraceGeodesicResult *
geometrycentral::surface::traceGeodesic
          (TraceGeodesicResult *__return_storage_ptr__,IntrinsicGeometryInterface *geom,
          Face startFace,Vector3 startBary,Vector3 traceBaryVec,TraceOptions *traceOptions)

{
  bool bVar1;
  Vector3 startPoint;
  TraceSubResult prevTraceEnd_00;
  Vector3 vecBary;
  Vector3 baryCoords;
  double dVar2;
  double dVar3;
  double dVar4;
  undefined8 uVar5;
  ParentMeshT *pPVar6;
  size_t sVar7;
  runtime_error *this;
  TraceOptions *pTVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  Face face;
  Vector2 vecCartesianDir;
  undefined8 in_stack_fffffffffffffe00;
  undefined8 in_stack_fffffffffffffe08;
  double in_stack_fffffffffffffe10;
  Vector2 local_158;
  double local_148;
  double dStack_140;
  double local_138;
  undefined1 local_128 [32];
  TraceSubResult prevTraceEnd;
  array<geometrycentral::Vector2,_3UL> vertexCoords;
  
  face.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.mesh =
       (ParentMeshT *)
       startFace.
       super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.ind;
  pTVar8 = traceOptions;
  IntrinsicGeometryInterface::requireVertexAngleSums(geom);
  IntrinsicGeometryInterface::requireHalfedgeVectorsInVertex(geom);
  IntrinsicGeometryInterface::requireHalfedgeVectorsInFace(geom);
  TraceGeodesicResult::TraceGeodesicResult(__return_storage_ptr__);
  bVar1 = traceOptions->includePath;
  __return_storage_ptr__->hasPath = bVar1;
  if (bVar1 == true) {
    prevTraceEnd.endPoint.edge.
    super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.mesh =
         (ParentMeshT *)startBary.z;
    prevTraceEnd.endPoint.vertex.
    super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.mesh =
         (ParentMeshT *)startBary.x;
    prevTraceEnd.endPoint.vertex.
    super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.ind =
         (size_t)startBary.y;
    prevTraceEnd._0_4_ = 2;
    prevTraceEnd.crossHe.
    super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.mesh =
         (ParentMeshT *)0x0;
    prevTraceEnd.crossHe.
    super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.ind =
         0xffffffffffffffff;
    prevTraceEnd.tCross = 0.0;
    prevTraceEnd.traceVectorInHalfedgeDir.x = -NAN;
    prevTraceEnd.traceVectorInHalfedgeDir.y = NAN;
    prevTraceEnd.traceVectorInHalfedgeLen =
         (double)startFace.
                 super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>
                 .mesh;
    prevTraceEnd.endPoint._0_8_ =
         face.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.
         mesh;
    ::std::
    vector<geometrycentral::surface::SurfacePoint,_std::allocator<geometrycentral::surface::SurfacePoint>_>
    ::emplace_back<geometrycentral::surface::SurfacePoint>
              (&__return_storage_ptr__->pathPoints,(SurfacePoint *)&prevTraceEnd);
  }
  dVar4 = traceBaryVec.z;
  dVar3 = traceBaryVec.y;
  dVar2 = traceBaryVec.x;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = traceBaryVec.x;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = traceBaryVec.z;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = traceBaryVec.y * traceBaryVec.y;
  auVar9 = vfmadd231sd_fma(auVar9,auVar10,auVar10);
  auVar9 = vfmadd231sd_fma(auVar9,auVar13,auVar13);
  if ((auVar9._0_8_ != 0.0) || (NAN(auVar9._0_8_))) {
    baryCoords.y = (double)in_stack_fffffffffffffe08;
    baryCoords.x = (double)in_stack_fffffffffffffe00;
    baryCoords.z = in_stack_fffffffffffffe10;
    projectInsideTriangle(baryCoords);
    sVar7 = prevTraceEnd.crossHe.
            super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
            .ind;
    pPVar6 = prevTraceEnd.crossHe.
             super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
             .mesh;
    uVar5 = prevTraceEnd._0_8_;
    prevTraceEnd._0_8_ = (dVar3 + dVar2 + dVar4) / 3.0;
    prevTraceEnd.crossHe.
    super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.mesh =
         (ParentMeshT *)prevTraceEnd._0_8_;
    prevTraceEnd.crossHe.
    super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.ind =
         prevTraceEnd._0_8_;
    Vector3::operator-=(&traceBaryVec,(Vector3 *)&prevTraceEnd);
    face.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.ind =
         (size_t)pTVar8;
    anon_unknown_2::vertexCoordinatesInTriangle
              (&vertexCoords,(anon_unknown_2 *)geom,
               (IntrinsicGeometryInterface *)
               startFace.
               super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.
               mesh,face);
    local_128._16_8_ = sVar7;
    local_138 = traceBaryVec.z;
    local_158.x = traceBaryVec.x * vertexCoords._M_elems[0].x +
                  traceBaryVec.y * vertexCoords._M_elems[1].x +
                  traceBaryVec.z * vertexCoords._M_elems[2].x;
    local_158.y = traceBaryVec.x * vertexCoords._M_elems[0].y +
                  traceBaryVec.y * vertexCoords._M_elems[1].y +
                  traceBaryVec.z * vertexCoords._M_elems[2].y;
    local_128._0_8_ = uVar5;
    local_128._8_8_ = pPVar6;
    local_148 = traceBaryVec.x;
    dStack_140 = traceBaryVec.y;
    vecCartesianDir = Vector2::normalize(&local_158);
    auVar11._8_8_ = 0;
    auVar11._0_8_ = local_158.x;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = local_158.y * local_158.y;
    auVar9 = vfmadd231sd_fma(auVar12,auVar11,auVar11);
    auVar9 = vsqrtsd_avx(auVar9,auVar9);
    startPoint.y = (double)local_128._8_8_;
    startPoint.x = (double)local_128._0_8_;
    startPoint.z = (double)local_128._16_8_;
    vecBary.y = dStack_140;
    vecBary.x = local_148;
    vecBary.z = local_138;
    anon_unknown_2::traceInFaceBarycentric
              (&prevTraceEnd,geom,startFace,startPoint,vecBary,vecCartesianDir,auVar9._0_8_,
               (array<bool,_3UL>)0x10101,traceOptions);
    prevTraceEnd_00.crossHe.
    super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.mesh =
         prevTraceEnd.crossHe.
         super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
         mesh;
    prevTraceEnd_00.terminated = prevTraceEnd.terminated;
    prevTraceEnd_00._1_7_ = prevTraceEnd._1_7_;
    prevTraceEnd_00.crossHe.
    super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.ind =
         prevTraceEnd.crossHe.
         super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
         ind;
    prevTraceEnd_00.tCross = prevTraceEnd.tCross;
    prevTraceEnd_00.traceVectorInHalfedgeDir.x = prevTraceEnd.traceVectorInHalfedgeDir.x;
    prevTraceEnd_00.traceVectorInHalfedgeDir.y = prevTraceEnd.traceVectorInHalfedgeDir.y;
    prevTraceEnd_00.traceVectorInHalfedgeLen = prevTraceEnd.traceVectorInHalfedgeLen;
    prevTraceEnd_00.endPoint.type = prevTraceEnd.endPoint.type;
    prevTraceEnd_00.endPoint._4_4_ = prevTraceEnd.endPoint._4_4_;
    prevTraceEnd_00.endPoint.vertex.
    super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.mesh =
         prevTraceEnd.endPoint.vertex.
         super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.mesh
    ;
    prevTraceEnd_00.endPoint.vertex.
    super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.ind =
         prevTraceEnd.endPoint.vertex.
         super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.ind;
    prevTraceEnd_00.endPoint.edge.
    super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.mesh =
         prevTraceEnd.endPoint.edge.
         super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.mesh;
    prevTraceEnd_00.endPoint.edge.
    super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.ind =
         prevTraceEnd.endPoint.edge.
         super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.ind;
    prevTraceEnd_00.endPoint.tEdge = prevTraceEnd.endPoint.tEdge;
    prevTraceEnd_00.endPoint.face.
    super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.mesh =
         prevTraceEnd.endPoint.face.
         super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.mesh;
    prevTraceEnd_00.endPoint.face.
    super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.ind =
         prevTraceEnd.endPoint.face.
         super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.ind;
    prevTraceEnd_00.endPoint.faceCoords.x = prevTraceEnd.endPoint.faceCoords.x;
    prevTraceEnd_00.endPoint.faceCoords.y = prevTraceEnd.endPoint.faceCoords.y;
    prevTraceEnd_00.endPoint.faceCoords.z = prevTraceEnd.endPoint.faceCoords.z;
    prevTraceEnd_00.incomingDirToPoint.x = prevTraceEnd.incomingDirToPoint.x;
    prevTraceEnd_00.incomingDirToPoint.y = prevTraceEnd.incomingDirToPoint.y;
    anon_unknown_2::traceGeodesic_iterative
              (geom,__return_storage_ptr__,prevTraceEnd_00,traceOptions);
    IntrinsicGeometryInterface::unrequireVertexAngleSums(geom);
    IntrinsicGeometryInterface::unrequireHalfedgeVectorsInVertex(geom);
    IntrinsicGeometryInterface::unrequireHalfedgeVectorsInFace(geom);
  }
  else {
    IntrinsicGeometryInterface::unrequireVertexAngleSums(geom);
    IntrinsicGeometryInterface::unrequireHalfedgeVectorsInVertex(geom);
    IntrinsicGeometryInterface::unrequireHalfedgeVectorsInFace(geom);
    if (traceOptions->errorOnProblem == true) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      ::std::runtime_error::runtime_error(this,"zero vec passed to trace, do something good here");
      __cxa_throw(this,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
    }
    (__return_storage_ptr__->endingDir).x = 0.0;
    (__return_storage_ptr__->endingDir).y = 0.0;
  }
  return __return_storage_ptr__;
}

Assistant:

TraceGeodesicResult traceGeodesic(IntrinsicGeometryInterface& geom, Face startFace, Vector3 startBary,
                                  Vector3 traceBaryVec, const TraceOptions& traceOptions) {


  geom.requireVertexAngleSums();
  geom.requireHalfedgeVectorsInVertex();
  geom.requireHalfedgeVectorsInFace();

  // The output data
  TraceGeodesicResult result;
  result.hasPath = traceOptions.includePath;
  if (traceOptions.includePath) {
    result.pathPoints.push_back(SurfacePoint(startFace, startBary));
  }

  if (TRACE_PRINT) {
    cout << "\n>>> Trace query (barycentric) from " << startFace << " " << startBary << " vec = " << traceBaryVec
         << endl;
  }

  // Early-out if zero
  if (traceBaryVec.norm2() == 0) {
    geom.unrequireVertexAngleSums();
    geom.unrequireHalfedgeVectorsInVertex();
    geom.unrequireHalfedgeVectorsInFace();

    // probably want to ensure we still return a point in a face...
    if (traceOptions.errorOnProblem) {
      throw std::runtime_error("zero vec passed to trace, do something good here");
    }

    result.endingDir = Vector2::zero();
    return result;
  }

  // Make sure the input is sane
  startBary = projectInsideTriangle(startBary);
  traceBaryVec -= Vector3::constant(sum(traceBaryVec) / 3);

  // Construct the cartesian equivalent
  std::array<Vector2, 3> vertexCoords = vertexCoordinatesInTriangle(geom, startFace);
  Vector2 traceVectorCartesian = barycentricDisplacementToCartesian(vertexCoords, traceBaryVec);

  // Trace the first point starting inside the face
  TraceSubResult prevTraceEnd =
      traceInFaceBarycentric(geom, startFace, startBary, traceBaryVec, unit(traceVectorCartesian),
                             norm(traceVectorCartesian), {true, true, true}, traceOptions);

  // Keep tracing through triangles until finished
  traceGeodesic_iterative(geom, result, prevTraceEnd, traceOptions);

  geom.unrequireVertexAngleSums();
  geom.unrequireHalfedgeVectorsInVertex();
  geom.unrequireHalfedgeVectorsInFace();

  return result;
}